

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

CURLcode file_do(connectdata *conn,_Bool *done)

{
  Curl_easy *data;
  Curl_easy *data_00;
  undefined8 *puVar1;
  long lVar2;
  CURLcode CVar3;
  _Bool _Var4;
  int iVar5;
  CURLcode CVar6;
  CURLcode CVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  __off64_t _Var11;
  size_t sVar12;
  size_t len;
  size_t sVar13;
  curl_off_t cVar14;
  size_t sVar15;
  undefined8 uVar16;
  char *pcVar17;
  char *pcVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  curltime cVar23;
  long local_178;
  tm buffer;
  char header [80];
  stat statbuf;
  
  data = conn->data;
  pcVar17 = (data->state).buffer;
  *done = true;
  Curl_pgrsStartNow(data);
  data_00 = conn->data;
  puVar1 = (undefined8 *)(data_00->req).protop;
  if (((data->set).field_0x913 & 0x20) == 0) {
    iVar9 = *(int *)(puVar1 + 2);
    iVar5 = fstat64(iVar9,(stat64 *)&statbuf);
    lVar19 = statbuf.st_size;
    if (iVar5 == -1) {
      lVar19 = 0;
      CVar6 = ~CURLE_OK;
    }
    else {
      (data->info).filetime = statbuf.st_mtim.tv_sec;
      if ((((data->state).range == (char *)0x0) && ((data->set).timecondition != CURL_TIMECOND_NONE)
          ) && (_Var4 = Curl_meets_timecondition(data,(data->info).filetime), !_Var4)) {
        *done = true;
        return CURLE_OK;
      }
      bVar21 = false;
      curl_msnprintf(header,0x50,"Content-Length: %ld\r\n");
      CVar6 = Curl_client_write(conn,2,header,0);
      if (CVar6 == CURLE_OK) {
        bVar21 = false;
        CVar6 = Curl_client_write(conn,2,"Accept-ranges: bytes\r\n",0);
        if (CVar6 == CURLE_OK) {
          CVar6 = Curl_gmtime(statbuf.st_mtim.tv_sec,&buffer);
          if (CVar6 == CURLE_OK) {
            iVar8 = 6;
            if (buffer.tm_wday != 0) {
              iVar8 = buffer.tm_wday + -1;
            }
            pcVar18 = "";
            if ((*(uint *)&(data->set).field_0x910 >> 0x1c & 1) == 0) {
              pcVar18 = "\r\n";
            }
            curl_msnprintf(header,0x50,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n%s",
                           Curl_wkday[iVar8],(ulong)(uint)buffer.tm_mday,Curl_month[buffer.tm_mon],
                           (ulong)(buffer.tm_year + 0x76c),(ulong)(uint)buffer.tm_hour,
                           (ulong)(uint)buffer.tm_min,(ulong)(uint)buffer.tm_sec,pcVar18);
            CVar6 = Curl_client_write(conn,2,header,0);
            if (CVar6 == CURLE_OK) {
              Curl_pgrsSetDownloadSize(data,lVar19);
              bVar21 = ((data->set).field_0x913 & 0x10) == 0;
              CVar6 = CURLE_OK;
            }
            else {
              bVar21 = false;
            }
          }
          else {
            bVar21 = false;
          }
        }
      }
      if (!bVar21) {
        return CVar6;
      }
    }
    CVar7 = Curl_range(conn);
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
    lVar20 = (data->state).resume_from;
    if (lVar20 < 0) {
      if (iVar5 == -1) {
        Curl_failf(data,"Can\'t get the size of file.");
        return CURLE_READ_ERROR;
      }
      (data->state).resume_from = lVar20 + statbuf.st_size;
    }
    lVar20 = (data->state).resume_from;
    if (lVar19 < lVar20) {
      Curl_failf(data,"failed to resume file:// transfer");
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
    bVar21 = iVar5 == -1;
    lVar2 = (data->req).maxdownload;
    lVar19 = lVar19 - lVar20;
    if (0 < lVar2) {
      lVar19 = lVar2;
    }
    bVar22 = lVar19 == 0;
    if (iVar5 != -1) {
      Curl_pgrsSetDownloadSize(data,lVar19);
    }
    lVar20 = (data->state).resume_from;
    if ((lVar20 != 0) && (_Var11 = lseek64(iVar9,lVar20,0), lVar20 != _Var11)) {
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
    lVar20 = 0;
    CVar7 = CURLE_OK;
    do {
      if (CVar7 != CURLE_OK) goto LAB_0010ab91;
      if (bVar21 || bVar22) {
        sVar12 = (data->set).buffer_size - 1;
      }
      else {
        sVar12 = (data->set).buffer_size;
        if (lVar19 < (long)sVar12) {
          sVar12 = curlx_sotouz(lVar19);
        }
      }
      len = read(iVar9,pcVar17,sVar12);
      if (0 < (long)len) {
        pcVar17[len] = '\0';
      }
      iVar5 = 3;
      CVar3 = CVar6;
      if ((0 < (long)len) && (lVar19 != 0 || (bVar21 || bVar22))) {
        lVar20 = lVar20 + len;
        sVar15 = len;
        if (bVar21 || bVar22) {
          sVar15 = 0;
        }
        lVar19 = lVar19 - sVar15;
        iVar5 = 1;
        CVar7 = Curl_client_write(conn,1,pcVar17,len);
        CVar3 = CVar7;
        if (CVar7 == CURLE_OK) {
          Curl_pgrsSetDownloadCounter(data,lVar20);
          iVar8 = Curl_pgrsUpdate(conn);
          CVar7 = CURLE_ABORTED_BY_CALLBACK;
          iVar5 = 0;
          CVar3 = CVar6;
          if (iVar8 == 0) {
            cVar23 = Curl_now();
            CVar7 = Curl_speedcheck(data,cVar23);
          }
        }
      }
      CVar6 = CVar3;
    } while (iVar5 == 0);
    if (iVar5 != 3) {
      return CVar6;
    }
LAB_0010ab91:
    iVar9 = Curl_pgrsUpdate(conn);
    if (iVar9 != 0) {
      return CURLE_ABORTED_BY_CALLBACK;
    }
    return CVar7;
  }
  pcVar17 = (char *)*puVar1;
  pcVar10 = strchr(pcVar17,0x2f);
  pcVar18 = (data_00->state).buffer;
  (data_00->req).upload_fromhere = pcVar18;
  if (pcVar10 == (char *)0x0) {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  if (pcVar10[1] == '\0') {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  iVar9 = open64(pcVar17,(uint)((data_00->state).resume_from != 0) * 0x200 + 0x241,
                 (data_00->set).new_file_perms);
  if (iVar9 < 0) {
    uVar16 = *puVar1;
    pcVar17 = "Can\'t open %s for writing";
LAB_0010a8c5:
    Curl_failf(data_00,pcVar17,uVar16);
    CVar6 = CURLE_WRITE_ERROR;
  }
  else {
    lVar19 = (data_00->state).infilesize;
    if (lVar19 != -1) {
      Curl_pgrsSetUploadSize(data_00,lVar19);
    }
    if ((data_00->state).resume_from < 0) {
      iVar5 = fstat64(iVar9,(stat64 *)&statbuf);
      if (iVar5 != 0) {
        close(iVar9);
        uVar16 = *puVar1;
        pcVar17 = "Can\'t get the size of %s";
        goto LAB_0010a8c5;
      }
      (data_00->state).resume_from = statbuf.st_size;
    }
    local_178 = 0;
    CVar6 = CURLE_OK;
    do {
      if (CVar6 != CURLE_OK) break;
      CVar6 = Curl_fillreadbuffer(conn,(data_00->set).buffer_size,(size_t *)header);
      if (CVar6 == CURLE_OK) {
        CVar6 = CURLE_OK;
        if (header._0_8_ != 0) {
          lVar19 = (data_00->state).resume_from;
          pcVar17 = pcVar18;
          sVar12 = header._0_8_;
          if (lVar19 != 0) {
            sVar13 = header._0_8_ - lVar19;
            lVar20 = 0;
            if (sVar13 != 0 && lVar19 <= (long)header._0_8_) {
              lVar20 = lVar19;
            }
            sVar12 = 0;
            if (sVar13 != 0 && lVar19 <= (long)header._0_8_) {
              sVar12 = sVar13;
            }
            cVar14 = -sVar13;
            if (lVar19 < (long)header._0_8_) {
              cVar14 = 0;
            }
            (data_00->state).resume_from = cVar14;
            pcVar17 = pcVar18 + lVar20;
          }
          sVar13 = write(iVar9,pcVar17,sVar12);
          if (sVar13 == sVar12) {
            local_178 = local_178 + sVar12;
            Curl_pgrsSetUploadCounter(data_00,local_178);
            iVar5 = Curl_pgrsUpdate(conn);
            CVar6 = CURLE_ABORTED_BY_CALLBACK;
            bVar21 = true;
            if (iVar5 == 0) {
              cVar23 = Curl_now();
              CVar6 = Curl_speedcheck(data_00,cVar23);
            }
            goto LAB_0010a78f;
          }
          CVar6 = CURLE_SEND_ERROR;
        }
        bVar21 = false;
      }
      else {
        bVar21 = false;
      }
LAB_0010a78f:
    } while (bVar21);
    if (CVar6 == CURLE_OK) {
      iVar5 = Curl_pgrsUpdate(conn);
      CVar6 = CURLE_ABORTED_BY_CALLBACK;
      if (iVar5 == 0) {
        CVar6 = CURLE_OK;
      }
    }
    close(iVar9);
  }
  return CVar6;
}

Assistant:

static CURLcode file_do(struct connectdata *conn, bool *done)
{
  /* This implementation ignores the host name in conformance with
     RFC 1738. Only local files (reachable via the standard file system)
     are supported. This means that files on remotely mounted directories
     (via NFS, Samba, NT sharing) can be accessed through a file:// URL
  */
  CURLcode result = CURLE_OK;
  struct_stat statbuf; /* struct_stat instead of struct stat just to allow the
                          Windows version to have a different struct without
                          having to redefine the simple word 'stat' */
  curl_off_t expected_size = 0;
  bool size_known;
  bool fstated = FALSE;
  struct Curl_easy *data = conn->data;
  char *buf = data->state.buffer;
  curl_off_t bytecount = 0;
  int fd;
  struct FILEPROTO *file;

  *done = TRUE; /* unconditionally */

  Curl_pgrsStartNow(data);

  if(data->set.upload)
    return file_upload(conn);

  file = conn->data->req.protop;

  /* get the fd from the connection phase */
  fd = file->fd;

  /* VMS: This only works reliable for STREAMLF files */
  if(-1 != fstat(fd, &statbuf)) {
    /* we could stat it, then read out the size */
    expected_size = statbuf.st_size;
    /* and store the modification time */
    data->info.filetime = statbuf.st_mtime;
    fstated = TRUE;
  }

  if(fstated && !data->state.range && data->set.timecondition) {
    if(!Curl_meets_timecondition(data, data->info.filetime)) {
      *done = TRUE;
      return CURLE_OK;
    }
  }

  if(fstated) {
    time_t filetime;
    struct tm buffer;
    const struct tm *tm = &buffer;
    char header[80];
    msnprintf(header, sizeof(header),
              "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n",
              expected_size);
    result = Curl_client_write(conn, CLIENTWRITE_HEADER, header, 0);
    if(result)
      return result;

    result = Curl_client_write(conn, CLIENTWRITE_HEADER,
                               (char *)"Accept-ranges: bytes\r\n", 0);
    if(result)
      return result;

    filetime = (time_t)statbuf.st_mtime;
    result = Curl_gmtime(filetime, &buffer);
    if(result)
      return result;

    /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
    msnprintf(header, sizeof(header),
              "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n%s",
              Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
              tm->tm_mday,
              Curl_month[tm->tm_mon],
              tm->tm_year + 1900,
              tm->tm_hour,
              tm->tm_min,
              tm->tm_sec,
              data->set.opt_no_body ? "": "\r\n");
    result = Curl_client_write(conn, CLIENTWRITE_HEADER, header, 0);
    if(result)
      return result;
    /* set the file size to make it available post transfer */
    Curl_pgrsSetDownloadSize(data, expected_size);
    if(data->set.opt_no_body)
      return result;
  }

  /* Check whether file range has been specified */
  result = Curl_range(conn);
  if(result)
    return result;

  /* Adjust the start offset in case we want to get the N last bytes
   * of the stream if the filesize could be determined */
  if(data->state.resume_from < 0) {
    if(!fstated) {
      failf(data, "Can't get the size of file.");
      return CURLE_READ_ERROR;
    }
    data->state.resume_from += (curl_off_t)statbuf.st_size;
  }

  if(data->state.resume_from <= expected_size)
    expected_size -= data->state.resume_from;
  else {
    failf(data, "failed to resume file:// transfer");
    return CURLE_BAD_DOWNLOAD_RESUME;
  }

  /* A high water mark has been specified so we obey... */
  if(data->req.maxdownload > 0)
    expected_size = data->req.maxdownload;

  if(!fstated || (expected_size == 0))
    size_known = FALSE;
  else
    size_known = TRUE;

  /* The following is a shortcut implementation of file reading
     this is both more efficient than the former call to download() and
     it avoids problems with select() and recv() on file descriptors
     in Winsock */
  if(fstated)
    Curl_pgrsSetDownloadSize(data, expected_size);

  if(data->state.resume_from) {
    if(data->state.resume_from !=
       lseek(fd, data->state.resume_from, SEEK_SET))
      return CURLE_BAD_DOWNLOAD_RESUME;
  }

  Curl_pgrsTime(data, TIMER_STARTTRANSFER);

  while(!result) {
    ssize_t nread;
    /* Don't fill a whole buffer if we want less than all data */
    size_t bytestoread;

    if(size_known) {
      bytestoread = (expected_size < data->set.buffer_size) ?
        curlx_sotouz(expected_size) : (size_t)data->set.buffer_size;
    }
    else
      bytestoread = data->set.buffer_size-1;

    nread = read(fd, buf, bytestoread);

    if(nread > 0)
      buf[nread] = 0;

    if(nread <= 0 || (size_known && (expected_size == 0)))
      break;

    bytecount += nread;
    if(size_known)
      expected_size -= nread;

    result = Curl_client_write(conn, CLIENTWRITE_BODY, buf, nread);
    if(result)
      return result;

    Curl_pgrsSetDownloadCounter(data, bytecount);

    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_now());
  }
  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;

  return result;
}